

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

bool __thiscall ByteCodeGenerator::ShouldLoadConstThis(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  
  if (funcInfo->thisConstantRegister == 0xffffffff) goto LAB_008026dc;
  BVar3 = FuncInfo::IsLambda(funcInfo);
  if (BVar3 == 0) {
    bVar2 = FuncInfo::IsGlobalFunction(funcInfo);
    if (bVar2) goto LAB_0080267a;
  }
  else {
LAB_0080267a:
    if ((funcInfo->thisSymbol == (Symbol *)0x0) && ((this->flags & 0x400) == 0)) goto LAB_008026dc;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar4 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                     ,0x1380,
                     "((funcInfo->IsLambda() || funcInfo->IsGlobalFunction()) && !funcInfo->GetThisSymbol() && !(this->flags & fscrEval))"
                     ,
                     "(funcInfo->IsLambda() || funcInfo->IsGlobalFunction()) && !funcInfo->GetThisSymbol() && !(this->flags & fscrEval)"
                    );
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar4 = 0;
LAB_008026dc:
  return funcInfo->thisConstantRegister != 0xffffffff;
}

Assistant:

bool ByteCodeGenerator::ShouldLoadConstThis(FuncInfo* funcInfo)
{
#if DBG
    // We should load a const 'this' binding if the following holds
    // - The function has a 'this' name node
    // - We are in a global or global lambda function
    // - The function has no 'this' symbol (an indirect eval would have this symbol)
    if (funcInfo->thisConstantRegister != Js::Constants::NoRegister)
    {
        Assert((funcInfo->IsLambda() || funcInfo->IsGlobalFunction())
            && !funcInfo->GetThisSymbol()
            && !(this->flags & fscrEval));
    }
#endif

    return funcInfo->thisConstantRegister != Js::Constants::NoRegister;
}